

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_ahead_log.cpp
# Opt level: O1

BufferedFileWriter * __thiscall duckdb::WriteAheadLog::Initialize(WriteAheadLog *this)

{
  unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>,_true>
  *this_00;
  _Head_base<0UL,_duckdb::BufferedFileWriter_*,_false> _Var1;
  int iVar2;
  type pBVar3;
  FileSystem *fs;
  _Head_base<0UL,_duckdb::BufferedFileWriter_*,_false> this_01;
  pointer pBVar4;
  idx_t iVar5;
  FileOpenFlags open_flags;
  
  if ((this->init_state)._M_i == INITIALIZED) {
    pBVar3 = unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>,_true>
             ::operator*(&this->writer);
    return pBVar3;
  }
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->wal_lock);
  if (iVar2 == 0) {
    this_00 = &this->writer;
    if ((this->writer).
        super_unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::BufferedFileWriter_*,_std::default_delete<duckdb::BufferedFileWriter>_>
        .super__Head_base<0UL,_duckdb::BufferedFileWriter_*,_false>._M_head_impl ==
        (BufferedFileWriter *)0x0) {
      fs = FileSystem::Get(this->database);
      this_01._M_head_impl = (BufferedFileWriter *)operator_new(0x50);
      open_flags.lock = NO_LOCK;
      open_flags.compression = UNCOMPRESSED;
      open_flags._10_6_ = 0;
      open_flags.flags = 0x2a;
      BufferedFileWriter::BufferedFileWriter(this_01._M_head_impl,fs,&this->wal_path,open_flags);
      _Var1._M_head_impl =
           (this_00->
           super_unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>
           )._M_t.
           super___uniq_ptr_impl<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::BufferedFileWriter_*,_std::default_delete<duckdb::BufferedFileWriter>_>
           .super__Head_base<0UL,_duckdb::BufferedFileWriter_*,_false>._M_head_impl;
      (this_00->
      super_unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>
      )._M_t.
      super___uniq_ptr_impl<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::BufferedFileWriter_*,_std::default_delete<duckdb::BufferedFileWriter>_>
      .super__Head_base<0UL,_duckdb::BufferedFileWriter_*,_false>._M_head_impl =
           this_01._M_head_impl;
      if (_Var1._M_head_impl != (BufferedFileWriter *)0x0) {
        (**(code **)(*(long *)&(_Var1._M_head_impl)->super_WriteStream + 0x10))();
      }
      if ((this->init_state)._M_i == UNINITIALIZED_REQUIRES_TRUNCATE) {
        pBVar4 = unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>,_true>
                 ::operator->(this_00);
        BufferedFileWriter::Truncate
                  (pBVar4,(this->wal_size).super___atomic_base<unsigned_long>._M_i);
      }
      pBVar4 = unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>,_true>
               ::operator->(this_00);
      iVar5 = BufferedFileWriter::GetFileSize(pBVar4);
      LOCK();
      (this->wal_size).super___atomic_base<unsigned_long>._M_i = iVar5;
      UNLOCK();
      LOCK();
      (this->init_state)._M_i = INITIALIZED;
      UNLOCK();
    }
    pBVar3 = unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>,_true>
             ::operator*(this_00);
    pthread_mutex_unlock((pthread_mutex_t *)&this->wal_lock);
    return pBVar3;
  }
  ::std::__throw_system_error(iVar2);
}

Assistant:

BufferedFileWriter &WriteAheadLog::Initialize() {
	if (Initialized()) {
		return *writer;
	}
	lock_guard<mutex> lock(wal_lock);
	if (!writer) {
		writer = make_uniq<BufferedFileWriter>(FileSystem::Get(database), wal_path,
		                                       FileFlags::FILE_FLAGS_WRITE | FileFlags::FILE_FLAGS_FILE_CREATE |
		                                           FileFlags::FILE_FLAGS_APPEND);
		if (init_state == WALInitState::UNINITIALIZED_REQUIRES_TRUNCATE) {
			writer->Truncate(wal_size);
		}
		wal_size = writer->GetFileSize();
		init_state = WALInitState::INITIALIZED;
	}
	return *writer;
}